

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O1

void annError(char *msg,ANNerr level)

{
  size_t sVar1;
  ostream *poVar2;
  
  if (level != ANNabort) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ANN: WARNING----->",0x12);
    if (msg == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10c168);
    }
    else {
      sVar1 = strlen(msg);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,msg,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"<-------------WARNING\n",0x16);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"ANN: ERROR------->");
  poVar2 = std::operator<<(poVar2,msg);
  std::operator<<(poVar2,"<-------------ERROR\n");
  exit(1);
}

Assistant:

void annError(char const *msg, ANNerr level) {
    if (level == ANNabort) {
        std::cerr << "ANN: ERROR------->" << msg << "<-------------ERROR\n";
        exit(1);
    } else {
        std::cerr << "ANN: WARNING----->" << msg << "<-------------WARNING\n";
    }
}